

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::AddCMakeProcessToCommandLines
          (cmQtAutoGenInitializer *this,string *infoFile,string *processName,
          cmCustomCommandLines *commandLines)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  reference pvVar5;
  undefined1 auVar6 [16];
  basic_string_view<char,_std::char_traits<char>_> local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  iterator local_1b8;
  undefined8 local_1b0;
  cmCustomCommandLine local_1a8;
  undefined1 local_190 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string autoInfoFileConfig;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  iterator local_108;
  undefined8 local_100;
  cmCustomCommandLine local_f8;
  reference local_e0;
  string *config;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  iterator local_50;
  undefined8 local_48;
  cmCustomCommandLine local_40;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *local_28;
  cmCustomCommandLines *commandLines_local;
  string *processName_local;
  string *infoFile_local;
  cmQtAutoGenInitializer *this_local;
  
  local_28 = &commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  commandLines_local = (cmCustomCommandLines *)processName;
  processName_local = infoFile;
  infoFile_local = (string *)this;
  if (((this->CrossConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
    if ((((this->MultiConfig & 1U) == 0) ||
        (uVar3 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x29])(), (uVar3 & 1) == 0)) &&
       ((this->CrossConfig & 1U) == 0)) {
      std::__cxx11::string::string
                ((string *)
                 &configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((this->MultiConfig & 1U) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_190);
        (*this->GlobalGen->_vptr_cmGlobalGenerator[0x3b])
                  (this->GlobalGen,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_190);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_190,0);
        std::__cxx11::string::operator=
                  ((string *)
                   &configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar5);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_190);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)
                   &configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"$<CONFIG>");
      }
      pvVar1 = local_28;
      psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_208 = (basic_string_view<char,_std::char_traits<char>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f8,"-E");
      local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)commandLines_local);
      local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)processName_local);
      local_1c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)
                             &configs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_1b8 = &local_208;
      local_1b0 = 5;
      ilist._M_len = 5;
      ilist._M_array = local_1b8;
      cmMakeCommandLine(&local_1a8,ilist);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (pvVar1,&local_1a8);
      cmCustomCommandLine::~cmCustomCommandLine(&local_1a8);
      std::__cxx11::string::~string
                ((string *)
                 &configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->ConfigsList);
      config = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->ConfigsList);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&config);
        if (!bVar2) break;
        local_e0 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        pvVar1 = local_28;
        psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        autoInfoFileConfig.field_2._8_8_ =
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"-E");
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)commandLines_local);
        local_138 = auVar6;
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)processName_local);
        local_128 = auVar6;
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e0);
        local_108 = (iterator)((long)&autoInfoFileConfig.field_2 + 8);
        local_100 = 5;
        ilist_00._M_len = 5;
        ilist_00._M_array = local_108;
        local_118 = auVar6;
        cmMakeCommandLine(&local_f8,ilist_00);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (pvVar1,&local_f8);
        cmCustomCommandLine::~cmCustomCommandLine(&local_f8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  else {
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_b0 = (basic_string_view<char,_std::char_traits<char>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"-E");
    local_90 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)commandLines_local);
    local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)processName_local)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"$<CONFIG>");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"$<COMMAND_CONFIG:$<CONFIG>>");
    local_50 = &local_b0;
    local_48 = 6;
    ilist_01._M_len = 6;
    ilist_01._M_array = local_50;
    cmMakeCommandLine(&local_40,ilist_01);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&commandLines->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,&local_40);
    cmCustomCommandLine::~cmCustomCommandLine(&local_40);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddCMakeProcessToCommandLines(
  std::string const& infoFile, std::string const& processName,
  cmCustomCommandLines& commandLines)
{
  if (this->CrossConfig && this->UseBetterGraph) {
    commandLines.push_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", processName, infoFile,
        "$<CONFIG>", "$<COMMAND_CONFIG:$<CONFIG>>" }));
  } else if ((this->MultiConfig && this->GlobalGen->IsXcode()) ||
             this->CrossConfig) {
    for (std::string const& config : this->ConfigsList) {
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E",
                            processName, infoFile, config }));
    }
  } else {
    std::string autoInfoFileConfig;
    if (this->MultiConfig) {
      autoInfoFileConfig = "$<CONFIG>";
    } else {
      std::vector<std::string> configs;
      this->GlobalGen->GetQtAutoGenConfigs(configs);
      autoInfoFileConfig = configs[0];
    }
    commandLines.push_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", processName,
                          infoFile, autoInfoFileConfig }));
  }
}